

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_util.c
# Opt level: O1

void dec_get_tb_width_height(int w,int h,com_part_size_t part,int *tb_w,int *tb_h)

{
  if (part == SIZE_hNx2N) {
    w = w >> 2;
  }
  else if (part == SIZE_2NxhN) {
    h = h >> 2;
  }
  else if (part == SIZE_NxN) {
    w = w >> 1;
    h = h >> 1;
  }
  *tb_w = w;
  *tb_h = h;
  return;
}

Assistant:

void dec_get_tb_width_height(int w, int h, com_part_size_t part, int *tb_w, int *tb_h)
{
    switch (part) {
    case SIZE_2Nx2N:
        break;
    case SIZE_NxN:
        w >>= 1;
        h >>= 1;
        break;
    case SIZE_2NxhN:
        h >>= 2;
        break;
    case SIZE_hNx2N:
        w >>= 2;
        break;
    default:
        uavs3d_assert(0);
        break;
    }

    *tb_w = w;
    *tb_h = h;
}